

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<int>>(char *label_id,GetterError<int> *getter)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 col;
  long lVar3;
  ImDrawList *this;
  int iVar4;
  int iVar5;
  float fVar6;
  ImVec2 p1;
  ImVec2 p2;
  undefined1 local_78 [8];
  double local_70;
  ImVec2 local_68;
  double local_60;
  double local_58;
  ImVec2 local_50;
  float local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar2 = BeginItem(label_id,-1);
  if (bVar2) {
    if ((GImPlot->FitThisFrame == true) && (iVar4 = getter->Count, 0 < iVar4)) {
      iVar5 = 0;
      do {
        lVar3 = (long)(((getter->Offset + iVar5) % iVar4 + iVar4) % iVar4) * (long)getter->Stride;
        local_78 = (undefined1  [8])(double)*(int *)((long)getter->Xs + lVar3);
        local_60 = (double)*(int *)((long)getter->Ys + lVar3);
        local_58 = (double)*(int *)((long)getter->Pos + lVar3);
        local_70 = local_60 - (double)*(int *)((long)getter->Neg + lVar3);
        local_68 = (ImVec2)local_78;
        FitPoint((ImPlotPoint *)local_78);
        local_70 = local_58 + local_60;
        local_78._0_4_ = local_68.x;
        local_78._4_4_ = local_68.y;
        FitPoint((ImPlotPoint *)local_78);
        iVar5 = iVar5 + 1;
        iVar4 = getter->Count;
      } while (iVar5 < iVar4);
    }
    pIVar1 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 4);
    iVar4 = getter->Count;
    if (0 < iVar4) {
      local_44 = (pIVar1->NextItemData).ErrorBarSize;
      fVar6 = local_44 * 0.5;
      iVar5 = 0;
      do {
        lVar3 = (long)(((getter->Offset + iVar5) % iVar4 + iVar4) % iVar4) * (long)getter->Stride;
        local_68 = (ImVec2)(double)*(int *)((long)getter->Xs + lVar3);
        local_60 = (double)*(int *)((long)getter->Ys + lVar3);
        local_58 = (double)*(int *)((long)getter->Pos + lVar3);
        local_78 = (undefined1  [8])
                   PlotToPixels((double)local_68,
                                local_60 - (double)*(int *)((long)getter->Neg + lVar3),-1);
        local_50 = PlotToPixels((double)local_68,local_58 + local_60,-1);
        ImDrawList::AddLine(this,(ImVec2 *)local_78,&local_50,col,
                            (pIVar1->NextItemData).ErrorBarWeight);
        if (0.0 < local_44) {
          local_40.x = fVar6 + (float)local_78._0_4_;
          local_38.x = (float)local_78._0_4_ - fVar6;
          local_38.y = (float)local_78._4_4_;
          local_40.y = (float)local_78._4_4_ + 0.0;
          ImDrawList::AddLine(this,&local_38,&local_40,col,(pIVar1->NextItemData).ErrorBarWeight);
          local_40.x = fVar6 + local_50.x;
          local_38.x = local_50.x - fVar6;
          local_38.y = local_50.y;
          local_40.y = local_50.y + 0.0;
          ImDrawList::AddLine(this,&local_38,&local_40,col,(pIVar1->NextItemData).ErrorBarWeight);
        }
        iVar5 = iVar5 + 1;
        iVar4 = getter->Count;
      } while (iVar5 < iVar4);
    }
    pIVar1 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar1->NextItemData);
    pIVar1->PreviousItem = pIVar1->CurrentItem;
    pIVar1->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}